

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adiosYAML.cpp
# Opt level: O0

Params * adios2::helper::anon_unknown_0::YAMLNodeMapToParams(Node *node,string *hint)

{
  bool bVar1;
  iterator_value *this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_bool>
  pVar2;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_bool>
  it;
  string value;
  string key;
  const_iterator itParam;
  Params *parameters;
  iterator_base<const_YAML::detail::iterator_value> *in_stack_fffffffffffffc68;
  iterator_base<const_YAML::detail::iterator_value> *in_stack_fffffffffffffc70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc78;
  undefined7 in_stack_fffffffffffffc80;
  undefined1 in_stack_fffffffffffffc87;
  string *in_stack_fffffffffffffcb8;
  string *in_stack_fffffffffffffcc0;
  string *in_stack_fffffffffffffcc8;
  string *in_stack_fffffffffffffcd0;
  string local_328 [16];
  Node *in_stack_fffffffffffffce8;
  string local_308 [39];
  allocator<char> local_2e1;
  string local_2e0 [39];
  allocator<char> local_2b9;
  iterator_base<const_YAML::detail::iterator_value> *in_stack_fffffffffffffd48;
  undefined1 local_291 [33];
  _Base_ptr local_270;
  undefined1 local_268;
  _Base_ptr local_260;
  undefined1 local_258;
  proxy local_250;
  string local_190 [32];
  proxy local_170;
  string local_b0 [151];
  undefined1 local_19;
  
  local_19 = 0;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         *)0x9d6bf9);
  YAML::Node::begin(in_stack_fffffffffffffce8);
  while( true ) {
    YAML::Node::end(in_stack_fffffffffffffce8);
    bVar1 = YAML::detail::iterator_base<YAML::detail::iterator_value_const>::operator!=
                      (in_stack_fffffffffffffc70,in_stack_fffffffffffffc68);
    YAML::detail::iterator_base<const_YAML::detail::iterator_value>::~iterator_base
              ((iterator_base<const_YAML::detail::iterator_value> *)0x9d6c51);
    if (!bVar1) break;
    YAML::detail::iterator_base<const_YAML::detail::iterator_value>::operator->
              (in_stack_fffffffffffffd48);
    this = YAML::detail::iterator_base<const_YAML::detail::iterator_value>::proxy::operator->
                     (&local_170);
    YAML::Node::as<std::__cxx11::string>(&this->super_Node);
    YAML::detail::iterator_base<const_YAML::detail::iterator_value>::proxy::~proxy
              ((proxy *)0x9d6d13);
    YAML::detail::iterator_base<const_YAML::detail::iterator_value>::operator->
              (in_stack_fffffffffffffd48);
    YAML::detail::iterator_base<const_YAML::detail::iterator_value>::proxy::operator->(&local_250);
    YAML::Node::as<std::__cxx11::string>(&this->super_Node);
    YAML::detail::iterator_base<const_YAML::detail::iterator_value>::proxy::~proxy
              ((proxy *)0x9d6d63);
    pVar2 = std::
            map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
            ::emplace<std::__cxx11::string_const&,std::__cxx11::string_const&>
                      ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)CONCAT17(in_stack_fffffffffffffc87,in_stack_fffffffffffffc80),
                       in_stack_fffffffffffffc78,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_fffffffffffffc70);
    local_270 = (_Base_ptr)pVar2.first._M_node;
    in_stack_fffffffffffffc87 = pVar2.second;
    local_268 = in_stack_fffffffffffffc87;
    local_260 = local_270;
    local_258 = in_stack_fffffffffffffc87;
    if (((undefined1  [16])pVar2 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
      in_stack_fffffffffffffc78 =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_291;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)(local_291 + 1),"Helper",(allocator *)in_stack_fffffffffffffc78);
      in_stack_fffffffffffffc70 = (iterator_base<const_YAML::detail::iterator_value> *)&local_2b9;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&stack0xfffffffffffffd48,"adiosYAML",
                 (allocator *)in_stack_fffffffffffffc70);
      in_stack_fffffffffffffc68 = (iterator_base<const_YAML::detail::iterator_value> *)&local_2e1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_2e0,"YAMLNodeMapToParams",(allocator *)in_stack_fffffffffffffc68);
      std::operator+((char *)in_stack_fffffffffffffcb8,in_RDI);
      std::operator+(in_stack_fffffffffffffc78,(char *)in_stack_fffffffffffffc70);
      std::operator+(in_stack_fffffffffffffc78,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffc70);
      Throw<std::invalid_argument>
                (in_stack_fffffffffffffcd0,in_stack_fffffffffffffcc8,in_stack_fffffffffffffcc0,
                 in_stack_fffffffffffffcb8,(int)((ulong)in_RDI >> 0x20));
      std::__cxx11::string::~string(local_308);
      std::__cxx11::string::~string(local_328);
      std::__cxx11::string::~string((string *)&stack0xfffffffffffffcb8);
      std::__cxx11::string::~string(local_2e0);
      std::allocator<char>::~allocator(&local_2e1);
      std::__cxx11::string::~string((string *)&stack0xfffffffffffffd48);
      std::allocator<char>::~allocator(&local_2b9);
      std::__cxx11::string::~string((string *)(local_291 + 1));
      std::allocator<char>::~allocator((allocator<char> *)local_291);
    }
    std::__cxx11::string::~string(local_190);
    std::__cxx11::string::~string(local_b0);
    YAML::detail::iterator_base<const_YAML::detail::iterator_value>::operator++
              (in_stack_fffffffffffffc70);
  }
  YAML::detail::iterator_base<const_YAML::detail::iterator_value>::~iterator_base
            ((iterator_base<const_YAML::detail::iterator_value> *)0x9d6c66);
  return (Params *)in_RDI;
}

Assistant:

Params YAMLNodeMapToParams(const YAML::Node &node, const std::string &hint)
{
    Params parameters;
    for (auto itParam = node.begin(); itParam != node.end(); ++itParam)
    {
        const std::string key = itParam->first.as<std::string>();
        const std::string value = itParam->second.as<std::string>();
        auto it = parameters.emplace(key, value);
        if (!it.second)
        {
            helper::Throw<std::invalid_argument>(
                "Helper", "adiosYAML", "YAMLNodeMapToParams",
                "found duplicated key : " + key + ", keys must be unique in a YAML node, " + hint);
        }
    }
    return parameters;
}